

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.cpp
# Opt level: O3

void * __thiscall booster::shared_object::resolve_symbol(shared_object *this,string *name)

{
  void *pvVar1;
  runtime_error *this_00;
  string local_40;
  
  pvVar1 = ((this->d).ptr_)->handle;
  if (pvVar1 != (void *)0x0) {
    pvVar1 = (void *)dlsym(pvVar1,(name->_M_dataplus)._M_p);
    return pvVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "booster::shared_object::resolve_symbol: the shared_object is not open!","");
  runtime_error::runtime_error(this_00,&local_40);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void shared_object::close()
	{
		if(d->handle) {
			FreeLibrary(d->handle);
			d->handle = 0;
		}
	}